

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

logical pnga_update44_ghosts(Integer g_a)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  global_array_t *pgVar5;
  int _d;
  Integer proc;
  logical lVar6;
  Integer *map;
  ulong *proclist;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  Integer IVar11;
  Integer IVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  Integer *pIVar23;
  C_Integer CVar24;
  Integer _last;
  char *pcVar25;
  int iVar26;
  int _ndim_4;
  ulong uVar27;
  Integer idx;
  long lVar28;
  long ndim;
  int _ndim;
  int local_6e8;
  int msglen;
  ulong local_6d0;
  long local_6c8;
  char *local_6c0;
  char *local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  ulong local_6a0;
  long local_698;
  int local_68c;
  int _index [7];
  Integer _hi [7];
  Integer np;
  long local_5a8;
  Integer local_5a0;
  int stride_rcv [7];
  int stride_snd [7];
  Integer slo_rcv [7];
  int count [7];
  Integer shi_rcv [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer width [7];
  Integer lo_loc [7];
  Integer index [7];
  Integer plo_rcv [7];
  Integer plo_snd [7];
  Integer ld_loc [7];
  Integer phi_snd [7];
  Integer phi_rcv [7];
  Integer lo_rcv [7];
  Integer hi_rcv [7];
  Integer dims [7];
  Integer increment [7];
  char rcv_name [32];
  char send_name [32];
  
  proc = pnga_nodeid();
  lVar6 = pnga_has_ghosts(g_a);
  pgVar5 = GA;
  if (lVar6 != 0) {
    lVar9 = g_a + 1000;
    local_6c8 = lVar9 * 0x368;
    iVar3 = GA[lVar9].elemsize;
    sVar1 = GA[lVar9].ndim;
    ndim = (long)sVar1;
    iVar4 = GA[lVar9].p_handle;
    if (0 < ndim) {
      sVar10 = ndim * 8;
      memset(increment,0,sVar10);
      memcpy(width,pgVar5[g_a + 1000].width,sVar10);
      memcpy(dims,pgVar5[g_a + 1000].dims,sVar10);
    }
    lVar6 = gai_check_ghost_distr(g_a);
    if (lVar6 == 0) {
      return 0;
    }
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_update44_ghosts:malloc failed (_ga_map)",0);
    }
    proclist = (ulong *)malloc(GAnproc << 3);
    if (proclist == (ulong *)0x0) {
      pnga_error("pnga_update44_ghosts:malloc failed (_ga_proclist)",0);
    }
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    pnga_proc_topology(g_a,proc,index);
    lVar9 = local_6c8;
    lVar15 = 1;
    if (0 < sVar1) {
      lVar7 = 0;
      do {
        lVar15 = lVar15 * ((hi_loc[lVar7] - lo_loc[lVar7]) + width[lVar7] * 2 + 1);
        lVar7 = lVar7 + 1;
      } while (ndim != lVar7);
    }
    uVar27 = 1;
    if (0 < sVar1) {
      lVar7 = 0;
      do {
        uVar8 = (lVar15 / ((hi_loc[lVar7] - lo_loc[lVar7]) + width[lVar7] * 2 + 1)) * width[lVar7];
        if ((long)uVar27 <= (long)uVar8) {
          uVar27 = uVar8;
        }
        lVar7 = lVar7 + 1;
      } while (ndim != lVar7);
    }
    builtin_strncpy(send_name,"send_buffer",0xc);
    builtin_strncpy(rcv_name,"receive_buffer",0xf);
    local_6b8 = (char *)pnga_malloc(uVar27,*(int *)((long)GA->dims + local_6c8 + -0x2c),send_name);
    local_6b0 = uVar27;
    local_6c0 = (char *)pnga_malloc(uVar27,*(int *)((long)GA->dims + lVar9 + -0x2c),rcv_name);
    if (0 < sVar1) {
      local_6b0 = (ulong)(uint)((int)local_6b0 * iVar3);
      local_6e8 = (int)proc;
      lVar9 = (long)local_6e8;
      local_68c = sVar1 + -1;
      local_5a8 = 1;
      if (1 < ndim + -1) {
        local_5a8 = ndim + -1;
      }
      idx = 0;
      local_698 = 0;
      local_5a0 = g_a;
      IVar12 = g_a;
      do {
        if (width[idx] != 0) {
          get_remote_block_neg(idx,ndim,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
          lVar6 = pnga_locate_region(IVar12,slo_rcv,shi_rcv,map,(Integer *)proclist,&np);
          if (lVar6 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA->name + local_6c8);
            sVar10 = strlen(err_string);
            sprintf(err_string + (int)sVar10," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
            sVar10 = strlen(err_string);
            iVar14 = (int)sVar10;
            IVar11 = pnga_ndim(IVar12);
            if (1 < IVar11) {
              lVar15 = 1;
              do {
                sprintf(err_string + (int)sVar10,",%ld:%ld ",slo_rcv[lVar15],shi_rcv[lVar15]);
                sVar10 = strlen(err_string);
                iVar14 = (int)sVar10;
                lVar15 = lVar15 + 1;
                IVar11 = pnga_ndim(IVar12);
              } while (lVar15 < IVar11);
            }
            (err_string + iVar14)[0] = ']';
            (err_string + iVar14)[1] = '\0';
            pnga_error(err_string,IVar12);
          }
          local_6d0 = *proclist;
          lVar15 = (long)iVar4 * 5;
          if (-1 < iVar4) {
            local_6d0 = (ulong)PGRP_LIST[iVar4].inv_map_proc_list[local_6d0];
          }
          lVar7 = 0;
          do {
            if (idx == lVar7) {
              lo_rcv[lVar7] = hi_loc[lVar7] + 1;
              lVar16 = hi_loc[lVar7] + width[lVar7];
            }
            else {
              lo_rcv[lVar7] = lo_loc[lVar7];
              lVar16 = hi_loc[lVar7];
            }
            hi_rcv[lVar7] = lVar16;
            lVar7 = lVar7 + 1;
          } while (ndim != lVar7);
          lVar7 = 0;
          do {
            if (idx == lVar7) {
              lVar16 = hi_rcv[lVar7];
              if (dims[lVar7] < lVar16) {
                slo_rcv[lVar7] = 1;
                lVar16 = width[lVar7];
              }
              else {
                slo_rcv[lVar7] = lo_rcv[lVar7];
              }
            }
            else {
              slo_rcv[lVar7] = lo_rcv[lVar7];
              lVar16 = hi_rcv[lVar7];
            }
            shi_rcv[lVar7] = lVar16;
            lVar7 = lVar7 + 1;
          } while (ndim != lVar7);
          lVar6 = pnga_locate_region(IVar12,slo_rcv,shi_rcv,map,(Integer *)proclist,&np);
          local_6a0 = lVar15;
          if (lVar6 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA->name + local_6c8);
            sVar10 = strlen(err_string);
            sprintf(err_string + (int)sVar10," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
            sVar10 = strlen(err_string);
            iVar14 = (int)sVar10;
            IVar11 = pnga_ndim(IVar12);
            if (1 < IVar11) {
              lVar15 = 1;
              do {
                sprintf(err_string + (int)sVar10,",%ld:%ld ",slo_rcv[lVar15],shi_rcv[lVar15]);
                sVar10 = strlen(err_string);
                iVar14 = (int)sVar10;
                lVar15 = lVar15 + 1;
                IVar11 = pnga_ndim(IVar12);
              } while (lVar15 < IVar11);
            }
            (err_string + iVar14)[0] = ']';
            (err_string + iVar14)[1] = '\0';
            pnga_error(err_string,IVar12);
          }
          lVar15 = local_6c8;
          pgVar5 = GA;
          local_6a8 = *proclist;
          if (-1 < iVar4) {
            local_6a8 = (ulong)(uint)(&PGRP_LIST->inv_map_proc_list)[local_6a0][local_6a8];
          }
          lVar7 = 0;
          do {
            if (increment[lVar7] == 0) {
              lVar16 = width[lVar7];
              plo_snd[lVar7] = lVar16;
              pIVar23 = phi_rcv;
              if (idx == lVar7) {
                phi_snd[lVar7] = lVar16 * 2 + -1;
                plo_rcv[lVar7] = lVar16 + (hi_loc[lVar7] - lo_loc[lVar7]) + 1;
                lVar17 = (hi_loc[lVar7] - lo_loc[lVar7]) + lVar16 * 2;
              }
              else {
                lVar17 = (hi_loc[lVar7] - lo_loc[lVar7]) + lVar16;
                phi_snd[lVar7] = lVar17;
                plo_rcv[lVar7] = lVar16;
              }
            }
            else {
              plo_rcv[lVar7] = 0;
              lVar17 = (hi_loc[lVar7] - lo_loc[lVar7]) + increment[lVar7];
              phi_rcv[lVar7] = lVar17;
              plo_snd[lVar7] = 0;
              pIVar23 = phi_snd;
            }
            pIVar23[lVar7] = lVar17;
            lVar7 = lVar7 + 1;
          } while (ndim != lVar7);
          uVar2 = *(ushort *)((long)GA->dims + local_6c8 + -0x30);
          uVar27 = (ulong)(short)uVar2;
          iVar14 = *(int *)((long)GA->block_dims + local_6c8 + -4);
          if (iVar14 - 1U < 3) {
            uVar8 = lVar9 % *(long *)((long)GA->num_blocks + local_6c8);
            _index[0] = (int)uVar8;
            if (1 < (short)uVar2) {
              uVar8 = uVar8 & 0xffffffff;
              lVar7 = 0;
              IVar12 = proc;
              do {
                IVar12 = (long)((int)IVar12 - (int)uVar8) / GA[g_a + 1000].num_blocks[lVar7];
                uVar8 = (long)(int)IVar12 % GA[g_a + 1000].num_blocks[lVar7 + 1];
                _index[lVar7 + 1] = (int)uVar8;
                lVar7 = lVar7 + 1;
              } while ((uVar27 & 0xffffffff) - 1 != lVar7);
            }
            if (0 < (short)uVar2) {
              lVar7 = 0;
              do {
                iVar19 = *(int *)((long)_index + lVar7);
                lVar16 = *(long *)((long)GA[g_a + 1000].block_dims + lVar7 * 2);
                *(long *)(err_string + lVar7 * 2) = lVar16 * iVar19 + 1;
                lVar16 = ((long)iVar19 + 1) * lVar16;
                *(long *)((long)_hi + lVar7 * 2) = lVar16;
                lVar17 = *(long *)((long)GA[g_a + 1000].dims + lVar7 * 2);
                if (lVar17 <= lVar16) {
                  lVar16 = lVar17;
                }
                *(long *)((long)_hi + lVar7 * 2) = lVar16;
                lVar7 = lVar7 + 4;
              } while ((uVar27 & 0xffffffff) << 2 != lVar7);
            }
          }
          else if (iVar14 == 4) {
            uVar8 = lVar9 % *(long *)((long)GA->num_blocks + local_6c8);
            _index[0] = (int)uVar8;
            if (1 < (short)uVar2) {
              uVar8 = uVar8 & 0xffffffff;
              lVar7 = 0;
              IVar12 = proc;
              do {
                IVar12 = (long)((int)IVar12 - (int)uVar8) / GA[g_a + 1000].num_blocks[lVar7];
                uVar8 = (long)(int)IVar12 % GA[g_a + 1000].num_blocks[lVar7 + 1];
                _index[lVar7 + 1] = (int)uVar8;
                lVar7 = lVar7 + 1;
              } while ((uVar27 & 0xffffffff) - 1 != lVar7);
            }
            if (0 < (short)uVar2) {
              lVar7 = *(long *)(GA->name + local_6c8 + -8);
              lVar16 = 0;
              iVar19 = 0;
              do {
                iVar26 = *(int *)((long)_index + lVar16);
                lVar17 = (long)iVar19 + (long)iVar26;
                *(undefined8 *)(err_string + lVar16 * 2) = *(undefined8 *)(lVar7 + lVar17 * 8);
                if ((long)iVar26 < *(long *)((long)GA->num_blocks + lVar16 * 2 + local_6c8) + -1) {
                  lVar17 = *(long *)(*(long *)(GA->name + local_6c8 + -8) + 8 + lVar17 * 8) + -1;
                }
                else {
                  lVar17 = *(long *)((long)GA->dims + lVar16 * 2 + local_6c8);
                }
                *(long *)((long)_hi + lVar16 * 2) = lVar17;
                iVar19 = iVar19 + *(int *)((long)GA->num_blocks + lVar16 * 2 + local_6c8);
                lVar16 = lVar16 + 4;
              } while ((uVar27 & 0xffffffff) << 2 != lVar16);
            }
          }
          else if (iVar14 == 0) {
            lVar7 = *(long *)((long)GA->old_nblock + local_6c8 + -0x30);
            if (lVar7 == 0) {
              if ((short)uVar2 < 1) {
                lVar7 = 1;
              }
              else {
                lVar7 = 1;
                uVar8 = 0;
                do {
                  lVar7 = lVar7 * GA[g_a + 1000].nblock[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar27 != uVar8);
              }
              if ((-1 < proc) && (proc < lVar7)) {
                if (0 < (short)uVar2) {
                  lVar7 = *(long *)(GA->name + local_6c8 + -8);
                  uVar8 = 0;
                  lVar16 = 0;
                  IVar12 = proc;
                  do {
                    lVar20 = (long)GA[g_a + 1000].nblock[uVar8];
                    lVar17 = lVar7 + (IVar12 % lVar20) * 8;
                    hi_loc[uVar8 - 0x20] = *(Integer *)(lVar17 + lVar16 * 8);
                    if (IVar12 % lVar20 == lVar20 + -1) {
                      CVar24 = GA[g_a + 1000].dims[uVar8];
                    }
                    else {
                      CVar24 = *(long *)(lVar17 + 8 + lVar16 * 8) + -1;
                    }
                    lVar16 = lVar16 + lVar20;
                    _hi[uVar8] = CVar24;
                    uVar8 = uVar8 + 1;
                    IVar12 = IVar12 / lVar20;
                  } while (uVar27 != uVar8);
                }
                goto LAB_00183d0d;
              }
            }
            else if (proc < lVar7) {
              if ((short)uVar2 < 1) {
                lVar7 = 1;
              }
              else {
                lVar7 = 1;
                uVar8 = 0;
                do {
                  lVar7 = lVar7 * GA[g_a + 1000].nblock[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar27 != uVar8);
              }
              if ((-1 < proc) && (proc < lVar7)) {
                if (0 < (short)uVar2) {
                  lVar7 = *(long *)(GA->name + local_6c8 + -8);
                  uVar8 = 0;
                  lVar16 = 0;
                  IVar12 = proc;
                  do {
                    lVar20 = (long)GA[g_a + 1000].nblock[uVar8];
                    lVar17 = lVar7 + (IVar12 % lVar20) * 8;
                    hi_loc[uVar8 - 0x20] = *(Integer *)(lVar17 + lVar16 * 8);
                    if (IVar12 % lVar20 == lVar20 + -1) {
                      CVar24 = GA[g_a + 1000].dims[uVar8];
                    }
                    else {
                      CVar24 = *(long *)(lVar17 + 8 + lVar16 * 8) + -1;
                    }
                    lVar16 = lVar16 + lVar20;
                    _hi[uVar8] = CVar24;
                    uVar8 = uVar8 + 1;
                    IVar12 = IVar12 / lVar20;
                  } while (uVar27 != uVar8);
                }
                goto LAB_00183d0d;
              }
            }
            if (0 < (short)uVar2) {
              memset(err_string,0,uVar27 * 8);
              memset(_hi,0xff,uVar27 * 8);
            }
          }
LAB_00183d0d:
          if (uVar27 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)pgVar5->width + local_6c8) * 2
                        + 1;
          }
          if ((short)uVar2 < 2) {
            lVar7 = 1;
            lVar16 = 0;
          }
          else {
            lVar7 = 1;
            lVar17 = 0;
            lVar16 = 0;
            do {
              lVar16 = lVar16 + plo_snd[lVar17] * lVar7;
              lVar20 = (_hi[lVar17] - hi_loc[lVar17 + -0x20]) + pgVar5[g_a + 1000].width[lVar17] * 2
                       + 1;
              ld_loc[lVar17] = lVar20;
              lVar7 = lVar7 * lVar20;
              lVar17 = lVar17 + 1;
            } while (uVar27 - 1 != lVar17);
          }
          lVar17 = plo_snd[uVar27 - 1];
          lVar20 = *(long *)(*(long *)(pgVar5->name + lVar15 + -0x10) + proc * 8);
          lVar13 = (long)*(int *)((long)pgVar5->dims + lVar15 + -0x18);
          if (iVar14 - 1U < 3) {
            uVar8 = lVar9 % *(long *)((long)pgVar5->num_blocks + lVar15);
            _index[0] = (int)uVar8;
            if (1 < (short)uVar2) {
              uVar8 = uVar8 & 0xffffffff;
              lVar15 = 0;
              IVar12 = proc;
              do {
                IVar12 = (long)((int)IVar12 - (int)uVar8) / pgVar5[g_a + 1000].num_blocks[lVar15];
                uVar8 = (long)(int)IVar12 % pgVar5[g_a + 1000].num_blocks[lVar15 + 1];
                _index[lVar15 + 1] = (int)uVar8;
                lVar15 = lVar15 + 1;
              } while ((uVar27 & 0xffffffff) - 1 != lVar15);
            }
            if (0 < (short)uVar2) {
              lVar15 = 0;
              do {
                iVar14 = *(int *)((long)_index + lVar15);
                lVar21 = *(long *)((long)pgVar5[g_a + 1000].block_dims + lVar15 * 2);
                *(long *)(err_string + lVar15 * 2) = lVar21 * iVar14 + 1;
                lVar21 = ((long)iVar14 + 1) * lVar21;
                *(long *)((long)_hi + lVar15 * 2) = lVar21;
                lVar18 = *(long *)((long)pgVar5[g_a + 1000].dims + lVar15 * 2);
                if (lVar18 <= lVar21) {
                  lVar21 = lVar18;
                }
                *(long *)((long)_hi + lVar15 * 2) = lVar21;
                lVar15 = lVar15 + 4;
              } while ((uVar27 & 0xffffffff) << 2 != lVar15);
            }
          }
          else if (iVar14 == 4) {
            uVar8 = lVar9 % *(long *)((long)pgVar5->num_blocks + lVar15);
            _index[0] = (int)uVar8;
            if (1 < (short)uVar2) {
              uVar8 = uVar8 & 0xffffffff;
              lVar21 = 0;
              IVar12 = proc;
              do {
                IVar12 = (long)((int)IVar12 - (int)uVar8) / pgVar5[g_a + 1000].num_blocks[lVar21];
                uVar8 = (long)(int)IVar12 % pgVar5[g_a + 1000].num_blocks[lVar21 + 1];
                _index[lVar21 + 1] = (int)uVar8;
                lVar21 = lVar21 + 1;
              } while ((uVar27 & 0xffffffff) - 1 != lVar21);
            }
            if (0 < (short)uVar2) {
              lVar21 = *(long *)(pgVar5->name + local_6c8 + -8);
              lVar18 = 0;
              iVar14 = 0;
              do {
                iVar19 = *(int *)((long)_index + lVar18);
                lVar22 = (long)iVar14 + (long)iVar19;
                *(undefined8 *)(err_string + lVar18 * 2) = *(undefined8 *)(lVar21 + lVar22 * 8);
                if ((long)iVar19 < *(long *)((long)pgVar5->num_blocks + lVar18 * 2 + lVar15) + -1) {
                  lVar22 = *(long *)(*(long *)(pgVar5->name + lVar15 + -8) + 8 + lVar22 * 8) + -1;
                }
                else {
                  lVar22 = *(long *)((long)pgVar5->dims + lVar18 * 2 + lVar15);
                }
                *(long *)((long)_hi + lVar18 * 2) = lVar22;
                iVar14 = iVar14 + *(int *)((long)pgVar5->num_blocks + lVar18 * 2 + lVar15);
                lVar18 = lVar18 + 4;
              } while ((uVar27 & 0xffffffff) << 2 != lVar18);
            }
          }
          else if (iVar14 == 0) {
            lVar21 = *(long *)((long)pgVar5->old_nblock + lVar15 + -0x30);
            if (lVar21 == 0) {
              if ((short)uVar2 < 1) {
                lVar21 = 1;
              }
              else {
                lVar21 = 1;
                uVar8 = 0;
                do {
                  lVar21 = lVar21 * pgVar5[g_a + 1000].nblock[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar27 != uVar8);
              }
              if ((proc < 0) || (lVar21 <= proc)) {
LAB_00184180:
                if (0 < (short)uVar2) {
                  memset(err_string,0,uVar27 << 3);
LAB_001841af:
                  memset(_hi,0xff,uVar27 << 3);
                }
              }
              else if (0 < (short)uVar2) {
                lVar15 = *(long *)(pgVar5->name + lVar15 + -8);
                lVar21 = 0;
                uVar8 = 0;
                IVar12 = proc;
                do {
                  lVar22 = (long)pgVar5[g_a + 1000].nblock[uVar8];
                  lVar18 = lVar15 + (IVar12 % lVar22) * 8;
                  hi_loc[uVar8 - 0x20] = *(Integer *)(lVar18 + lVar21 * 8);
                  if (IVar12 % lVar22 == lVar22 + -1) {
                    CVar24 = pgVar5[g_a + 1000].dims[uVar8];
                  }
                  else {
                    CVar24 = *(long *)(lVar18 + 8 + lVar21 * 8) + -1;
                  }
                  lVar21 = lVar21 + lVar22;
                  _hi[uVar8] = CVar24;
                  uVar8 = uVar8 + 1;
                  IVar12 = IVar12 / lVar22;
                } while (uVar27 != uVar8);
              }
            }
            else if (proc < lVar21) {
              if ((short)uVar2 < 1) {
                lVar21 = 1;
              }
              else {
                lVar21 = 1;
                uVar8 = 0;
                do {
                  lVar21 = lVar21 * pgVar5[g_a + 1000].nblock[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar27 != uVar8);
              }
              if ((proc < 0) || (lVar21 <= proc)) goto LAB_00184180;
              if (0 < (short)uVar2) {
                lVar15 = *(long *)(pgVar5->name + lVar15 + -8);
                lVar21 = 0;
                uVar8 = 0;
                IVar12 = proc;
                do {
                  lVar22 = (long)pgVar5[g_a + 1000].nblock[uVar8];
                  lVar18 = lVar15 + (IVar12 % lVar22) * 8;
                  hi_loc[uVar8 - 0x20] = *(Integer *)(lVar18 + lVar21 * 8);
                  if (IVar12 % lVar22 == lVar22 + -1) {
                    CVar24 = pgVar5[g_a + 1000].dims[uVar8];
                  }
                  else {
                    CVar24 = *(long *)(lVar18 + 8 + lVar21 * 8) + -1;
                  }
                  lVar21 = lVar21 + lVar22;
                  _hi[uVar8] = CVar24;
                  uVar8 = uVar8 + 1;
                  IVar12 = IVar12 / lVar22;
                } while (uVar27 != uVar8);
              }
            }
            else if (0 < (short)uVar2) {
              memset(err_string,0,(ulong)uVar2 << 3);
              goto LAB_001841af;
            }
          }
          pcVar25 = local_6b8;
          if (uVar27 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)pgVar5->width + local_6c8) * 2
                        + 1;
          }
          if ((short)uVar2 < 2) {
            lVar21 = 1;
            lVar15 = 0;
          }
          else {
            lVar21 = 1;
            lVar15 = 0;
            lVar18 = 0;
            do {
              lVar15 = lVar15 + plo_rcv[lVar18] * lVar21;
              lVar22 = (_hi[lVar18] - hi_loc[lVar18 + -0x20]) + pgVar5[g_a + 1000].width[lVar18] * 2
                       + 1;
              ld_loc[lVar18] = lVar22;
              lVar21 = lVar21 * lVar22;
              lVar18 = lVar18 + 1;
            } while (uVar27 - 1 != lVar18);
          }
          lVar18 = plo_rcv[uVar27 - 1];
          stride_snd[0] = iVar3;
          stride_rcv[0] = iVar3;
          if (sVar1 != 1) {
            lVar22 = 0;
            iVar14 = iVar3;
            iVar19 = iVar3;
            do {
              IVar12 = ld_loc[lVar22];
              iVar19 = iVar19 * (int)IVar12;
              stride_rcv[lVar22] = iVar19;
              iVar14 = iVar14 * (int)IVar12;
              stride_snd[lVar22] = iVar14;
              stride_rcv[lVar22 + 1] = iVar19;
              stride_snd[lVar22 + 1] = iVar14;
              lVar22 = lVar22 + 1;
            } while (local_5a8 != lVar22);
          }
          lVar22 = 0;
          do {
            count[lVar22] = ((int)phi_rcv[lVar22] - (int)plo_rcv[lVar22]) + 1;
            lVar22 = lVar22 + 1;
          } while (ndim != lVar22);
          lVar28 = 1;
          lVar22 = 0;
          do {
            lVar28 = lVar28 * ((phi_snd[lVar22] - plo_snd[lVar22]) + 1);
            lVar22 = lVar22 + 1;
          } while (ndim != lVar22);
          count[0] = count[0] * iVar3;
          armci_write_strided((void *)((lVar7 * lVar17 + lVar16) * lVar13 + lVar20),local_68c,
                              stride_snd,count,local_6b8);
          if (GAme != local_6d0) {
            iVar19 = (int)lVar28 * iVar3;
            uVar27 = (ulong)*(int *)((long)GA->nblock + idx * 4 + local_6c8);
            iVar14 = (int)local_698;
            if ((uVar27 & 1) == 0) {
              if ((*(byte *)(index + idx) & 1) == 0) {
                armci_msg_rcv(iVar14,local_6c0,(int)local_6b0,&msglen,(int)local_6a8);
              }
              else {
                armci_msg_snd(iVar14,local_6b8,iVar19,(int)local_6d0);
              }
              if ((*(byte *)(index + idx) & 1) == 0) {
                armci_msg_snd((int)local_698,local_6b8,iVar19,(int)local_6d0);
                pcVar25 = local_6c0;
                goto LAB_001844fc;
              }
            }
            else {
              uVar27 = uVar27 - 1;
              if ((index[idx] & 1U) == 0) {
                if (index[idx] != uVar27) {
                  armci_msg_rcv(iVar14,local_6c0,(int)local_6b0,&msglen,(int)local_6a8);
                }
              }
              else {
                armci_msg_snd(iVar14,local_6b8,iVar19,(int)local_6d0);
              }
              if ((index[idx] & 1U) == 0) {
                iVar14 = (int)local_6d0;
                if (index[idx] != 0) {
                  armci_msg_snd((int)local_698,local_6b8,iVar19,iVar14);
                  goto LAB_001844a7;
                }
              }
              else {
                armci_msg_rcv((int)local_698,local_6c0,(int)local_6b0,&msglen,(int)local_6a8);
LAB_001844a7:
                iVar14 = (int)local_6d0;
              }
              if (index[idx] == 0) {
                armci_msg_snd((int)local_698,local_6b8,iVar19,iVar14);
              }
              pcVar25 = local_6c0;
              if (index[idx] != uVar27) goto LAB_001844fc;
            }
            pcVar25 = local_6c0;
            armci_msg_rcv((int)local_698,local_6c0,(int)local_6b0,&msglen,(int)local_6a8);
          }
LAB_001844fc:
          armci_read_strided((void *)((lVar21 * lVar18 + lVar15) * lVar13 + lVar20),local_68c,
                             stride_rcv,count,pcVar25);
          get_remote_block_pos(idx,ndim,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
          IVar12 = local_5a0;
          lVar6 = pnga_locate_region(local_5a0,slo_rcv,shi_rcv,map,(Integer *)proclist,&np);
          if (lVar6 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA->name + local_6c8);
            sVar10 = strlen(err_string);
            sprintf(err_string + (int)sVar10," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
            sVar10 = strlen(err_string);
            iVar14 = (int)sVar10;
            IVar11 = pnga_ndim(IVar12);
            if (1 < IVar11) {
              lVar15 = 1;
              do {
                sprintf(err_string + (int)sVar10,",%ld:%ld ",slo_rcv[lVar15],shi_rcv[lVar15]);
                sVar10 = strlen(err_string);
                iVar14 = (int)sVar10;
                lVar15 = lVar15 + 1;
                IVar11 = pnga_ndim(IVar12);
              } while (lVar15 < IVar11);
            }
            (err_string + iVar14)[0] = ']';
            (err_string + iVar14)[1] = '\0';
            pnga_error(err_string,IVar12);
          }
          uVar27 = local_6a0;
          local_6a8 = *proclist;
          if (-1 < iVar4) {
            local_6a8 = (ulong)(uint)(&PGRP_LIST->inv_map_proc_list)[local_6a0][local_6a8];
          }
          local_6d0 = local_698 + 1;
          lVar15 = 0;
          do {
            lVar7 = lo_loc[lVar15];
            if (idx == lVar15) {
              lo_rcv[lVar15] = lVar7 - width[lVar15];
              lVar7 = lVar7 + -1;
            }
            else {
              lo_rcv[lVar15] = lVar7;
              lVar7 = hi_loc[lVar15];
            }
            hi_rcv[lVar15] = lVar7;
            lVar15 = lVar15 + 1;
          } while (ndim != lVar15);
          lVar15 = 0;
          do {
            if (idx == lVar15) {
              lVar7 = hi_rcv[lVar15];
              if (lVar7 < 1) {
                lVar7 = dims[lVar15];
                lVar16 = (lVar7 - width[lVar15]) + 1;
              }
              else {
                lVar16 = lo_rcv[lVar15];
              }
              slo_rcv[lVar15] = lVar16;
            }
            else {
              slo_rcv[lVar15] = lo_rcv[lVar15];
              lVar7 = hi_rcv[lVar15];
            }
            shi_rcv[lVar15] = lVar7;
            lVar15 = lVar15 + 1;
          } while (ndim != lVar15);
          lVar6 = pnga_locate_region(IVar12,slo_rcv,shi_rcv,map,(Integer *)proclist,&np);
          if (lVar6 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA->name + local_6c8);
            sVar10 = strlen(err_string);
            sprintf(err_string + (int)sVar10," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
            sVar10 = strlen(err_string);
            iVar14 = (int)sVar10;
            IVar11 = pnga_ndim(IVar12);
            if (1 < IVar11) {
              lVar15 = 1;
              do {
                sprintf(err_string + (int)sVar10,",%ld:%ld ",slo_rcv[lVar15],shi_rcv[lVar15]);
                sVar10 = strlen(err_string);
                iVar14 = (int)sVar10;
                lVar15 = lVar15 + 1;
                IVar11 = pnga_ndim(IVar12);
              } while (lVar15 < IVar11);
            }
            (err_string + iVar14)[0] = ']';
            (err_string + iVar14)[1] = '\0';
            pnga_error(err_string,IVar12);
            uVar27 = local_6a0;
          }
          lVar15 = local_6c8;
          pgVar5 = GA;
          local_6a0 = *proclist;
          if (-1 < iVar4) {
            local_6a0 = (ulong)(&PGRP_LIST->inv_map_proc_list)[uVar27][local_6a0];
          }
          lVar7 = 0;
          do {
            if (increment[lVar7] == 0) {
              pIVar23 = phi_rcv;
              if (idx == lVar7) {
                plo_snd[lVar7] = (hi_loc[lVar7] - lo_loc[lVar7]) + 1;
                phi_snd[lVar7] = (hi_loc[lVar7] - lo_loc[lVar7]) + width[lVar7];
                plo_rcv[lVar7] = 0;
                lVar17 = width[lVar7] + -1;
              }
              else {
                lVar16 = width[lVar7];
                plo_snd[lVar7] = lVar16;
                lVar17 = (hi_loc[lVar7] - lo_loc[lVar7]) + lVar16;
                phi_snd[lVar7] = lVar17;
                plo_rcv[lVar7] = lVar16;
              }
            }
            else {
              plo_rcv[lVar7] = 0;
              lVar17 = (hi_loc[lVar7] - lo_loc[lVar7]) + increment[lVar7];
              phi_rcv[lVar7] = lVar17;
              plo_snd[lVar7] = 0;
              pIVar23 = phi_snd;
            }
            pIVar23[lVar7] = lVar17;
            lVar7 = lVar7 + 1;
          } while (ndim != lVar7);
          uVar2 = *(ushort *)((long)GA->dims + local_6c8 + -0x30);
          uVar27 = (ulong)(short)uVar2;
          iVar14 = *(int *)((long)GA->block_dims + local_6c8 + -4);
          if (iVar14 - 1U < 3) {
            uVar8 = lVar9 % *(long *)((long)GA->num_blocks + local_6c8);
            _index[0] = (int)uVar8;
            if (1 < (short)uVar2) {
              uVar8 = uVar8 & 0xffffffff;
              lVar7 = 0;
              IVar12 = proc;
              do {
                IVar12 = (long)((int)IVar12 - (int)uVar8) / GA[g_a + 1000].num_blocks[lVar7];
                uVar8 = (long)(int)IVar12 % GA[g_a + 1000].num_blocks[lVar7 + 1];
                _index[lVar7 + 1] = (int)uVar8;
                lVar7 = lVar7 + 1;
              } while ((uVar27 & 0xffffffff) - 1 != lVar7);
            }
            if (0 < (short)uVar2) {
              lVar7 = 0;
              do {
                iVar19 = *(int *)((long)_index + lVar7);
                lVar16 = *(long *)((long)GA[g_a + 1000].block_dims + lVar7 * 2);
                *(long *)(err_string + lVar7 * 2) = lVar16 * iVar19 + 1;
                lVar16 = ((long)iVar19 + 1) * lVar16;
                *(long *)((long)_hi + lVar7 * 2) = lVar16;
                lVar17 = *(long *)((long)GA[g_a + 1000].dims + lVar7 * 2);
                if (lVar17 <= lVar16) {
                  lVar16 = lVar17;
                }
                *(long *)((long)_hi + lVar7 * 2) = lVar16;
                lVar7 = lVar7 + 4;
              } while ((uVar27 & 0xffffffff) << 2 != lVar7);
            }
          }
          else if (iVar14 == 4) {
            uVar8 = lVar9 % *(long *)((long)GA->num_blocks + local_6c8);
            _index[0] = (int)uVar8;
            if (1 < (short)uVar2) {
              uVar8 = uVar8 & 0xffffffff;
              lVar7 = 0;
              IVar12 = proc;
              do {
                IVar12 = (long)((int)IVar12 - (int)uVar8) / GA[g_a + 1000].num_blocks[lVar7];
                uVar8 = (long)(int)IVar12 % GA[g_a + 1000].num_blocks[lVar7 + 1];
                _index[lVar7 + 1] = (int)uVar8;
                lVar7 = lVar7 + 1;
              } while ((uVar27 & 0xffffffff) - 1 != lVar7);
            }
            if (0 < (short)uVar2) {
              lVar7 = *(long *)(GA->name + local_6c8 + -8);
              lVar16 = 0;
              iVar19 = 0;
              do {
                iVar26 = *(int *)((long)_index + lVar16);
                lVar17 = (long)iVar19 + (long)iVar26;
                *(undefined8 *)(err_string + lVar16 * 2) = *(undefined8 *)(lVar7 + lVar17 * 8);
                if ((long)iVar26 < *(long *)((long)GA->num_blocks + lVar16 * 2 + local_6c8) + -1) {
                  lVar17 = *(long *)(*(long *)(GA->name + local_6c8 + -8) + 8 + lVar17 * 8) + -1;
                }
                else {
                  lVar17 = *(long *)((long)GA->dims + lVar16 * 2 + local_6c8);
                }
                *(long *)((long)_hi + lVar16 * 2) = lVar17;
                iVar19 = iVar19 + *(int *)((long)GA->num_blocks + lVar16 * 2 + local_6c8);
                lVar16 = lVar16 + 4;
              } while ((uVar27 & 0xffffffff) << 2 != lVar16);
            }
          }
          else if (iVar14 == 0) {
            lVar7 = *(long *)((long)GA->old_nblock + local_6c8 + -0x30);
            if (lVar7 == 0) {
              if ((short)uVar2 < 1) {
                lVar7 = 1;
              }
              else {
                lVar7 = 1;
                uVar8 = 0;
                do {
                  lVar7 = lVar7 * GA[g_a + 1000].nblock[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar27 != uVar8);
              }
              if ((-1 < proc) && (proc < lVar7)) {
                if (0 < (short)uVar2) {
                  lVar7 = *(long *)(GA->name + local_6c8 + -8);
                  lVar16 = 0;
                  uVar8 = 0;
                  IVar12 = proc;
                  do {
                    lVar20 = (long)GA[g_a + 1000].nblock[uVar8];
                    lVar17 = lVar7 + (IVar12 % lVar20) * 8;
                    hi_loc[uVar8 - 0x20] = *(Integer *)(lVar17 + lVar16 * 8);
                    if (IVar12 % lVar20 == lVar20 + -1) {
                      CVar24 = GA[g_a + 1000].dims[uVar8];
                    }
                    else {
                      CVar24 = *(long *)(lVar17 + 8 + lVar16 * 8) + -1;
                    }
                    lVar16 = lVar16 + lVar20;
                    _hi[uVar8] = CVar24;
                    uVar8 = uVar8 + 1;
                    IVar12 = IVar12 / lVar20;
                  } while (uVar27 != uVar8);
                }
                goto LAB_00184dc4;
              }
            }
            else if (proc < lVar7) {
              if ((short)uVar2 < 1) {
                lVar7 = 1;
              }
              else {
                lVar7 = 1;
                uVar8 = 0;
                do {
                  lVar7 = lVar7 * GA[g_a + 1000].nblock[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar27 != uVar8);
              }
              if ((-1 < proc) && (proc < lVar7)) {
                if (0 < (short)uVar2) {
                  lVar7 = *(long *)(GA->name + local_6c8 + -8);
                  lVar16 = 0;
                  uVar8 = 0;
                  IVar12 = proc;
                  do {
                    lVar20 = (long)GA[g_a + 1000].nblock[uVar8];
                    lVar17 = lVar7 + (IVar12 % lVar20) * 8;
                    hi_loc[uVar8 - 0x20] = *(Integer *)(lVar17 + lVar16 * 8);
                    if (IVar12 % lVar20 == lVar20 + -1) {
                      CVar24 = GA[g_a + 1000].dims[uVar8];
                    }
                    else {
                      CVar24 = *(long *)(lVar17 + 8 + lVar16 * 8) + -1;
                    }
                    lVar16 = lVar16 + lVar20;
                    _hi[uVar8] = CVar24;
                    uVar8 = uVar8 + 1;
                    IVar12 = IVar12 / lVar20;
                  } while (uVar27 != uVar8);
                }
                goto LAB_00184dc4;
              }
            }
            if (0 < (short)uVar2) {
              memset(err_string,0,uVar27 * 8);
              memset(_hi,0xff,uVar27 * 8);
            }
          }
LAB_00184dc4:
          if (uVar27 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)pgVar5->width + local_6c8) * 2
                        + 1;
          }
          if ((short)uVar2 < 2) {
            lVar7 = 1;
            lVar16 = 0;
          }
          else {
            lVar7 = 1;
            lVar16 = 0;
            lVar17 = 0;
            do {
              lVar16 = lVar16 + plo_snd[lVar17] * lVar7;
              lVar20 = (_hi[lVar17] - hi_loc[lVar17 + -0x20]) + pgVar5[g_a + 1000].width[lVar17] * 2
                       + 1;
              ld_loc[lVar17] = lVar20;
              lVar7 = lVar7 * lVar20;
              lVar17 = lVar17 + 1;
            } while (uVar27 - 1 != lVar17);
          }
          lVar17 = plo_snd[uVar27 - 1];
          lVar20 = *(long *)(*(long *)(pgVar5->name + lVar15 + -0x10) + proc * 8);
          lVar13 = (long)*(int *)((long)pgVar5->dims + lVar15 + -0x18);
          if (iVar14 - 1U < 3) {
            uVar8 = lVar9 % *(long *)((long)pgVar5->num_blocks + lVar15);
            _index[0] = (int)uVar8;
            if (1 < (short)uVar2) {
              uVar8 = uVar8 & 0xffffffff;
              lVar15 = 0;
              IVar12 = proc;
              do {
                IVar12 = (long)((int)IVar12 - (int)uVar8) / pgVar5[g_a + 1000].num_blocks[lVar15];
                uVar8 = (long)(int)IVar12 % pgVar5[g_a + 1000].num_blocks[lVar15 + 1];
                _index[lVar15 + 1] = (int)uVar8;
                lVar15 = lVar15 + 1;
              } while ((uVar27 & 0xffffffff) - 1 != lVar15);
            }
            if (0 < (short)uVar2) {
              lVar15 = 0;
              do {
                iVar14 = *(int *)((long)_index + lVar15);
                lVar21 = *(long *)((long)pgVar5[g_a + 1000].block_dims + lVar15 * 2);
                *(long *)(err_string + lVar15 * 2) = lVar21 * iVar14 + 1;
                lVar21 = ((long)iVar14 + 1) * lVar21;
                *(long *)((long)_hi + lVar15 * 2) = lVar21;
                lVar18 = *(long *)((long)pgVar5[g_a + 1000].dims + lVar15 * 2);
                if (lVar18 <= lVar21) {
                  lVar21 = lVar18;
                }
                *(long *)((long)_hi + lVar15 * 2) = lVar21;
                lVar15 = lVar15 + 4;
              } while ((uVar27 & 0xffffffff) << 2 != lVar15);
            }
          }
          else if (iVar14 == 4) {
            uVar8 = lVar9 % *(long *)((long)pgVar5->num_blocks + lVar15);
            _index[0] = (int)uVar8;
            if (1 < (short)uVar2) {
              uVar8 = uVar8 & 0xffffffff;
              lVar21 = 0;
              IVar12 = proc;
              do {
                IVar12 = (long)((int)IVar12 - (int)uVar8) / pgVar5[g_a + 1000].num_blocks[lVar21];
                uVar8 = (long)(int)IVar12 % pgVar5[g_a + 1000].num_blocks[lVar21 + 1];
                _index[lVar21 + 1] = (int)uVar8;
                lVar21 = lVar21 + 1;
              } while ((uVar27 & 0xffffffff) - 1 != lVar21);
            }
            if (0 < (short)uVar2) {
              lVar21 = *(long *)(pgVar5->name + local_6c8 + -8);
              lVar18 = 0;
              iVar14 = 0;
              do {
                iVar19 = *(int *)((long)_index + lVar18);
                lVar22 = (long)iVar14 + (long)iVar19;
                *(undefined8 *)(err_string + lVar18 * 2) = *(undefined8 *)(lVar21 + lVar22 * 8);
                if ((long)iVar19 < *(long *)((long)pgVar5->num_blocks + lVar18 * 2 + lVar15) + -1) {
                  lVar22 = *(long *)(*(long *)(pgVar5->name + lVar15 + -8) + 8 + lVar22 * 8) + -1;
                }
                else {
                  lVar22 = *(long *)((long)pgVar5->dims + lVar18 * 2 + lVar15);
                }
                *(long *)((long)_hi + lVar18 * 2) = lVar22;
                iVar14 = iVar14 + *(int *)((long)pgVar5->num_blocks + lVar18 * 2 + lVar15);
                lVar18 = lVar18 + 4;
              } while ((uVar27 & 0xffffffff) << 2 != lVar18);
            }
          }
          else if (iVar14 == 0) {
            lVar21 = *(long *)((long)pgVar5->old_nblock + lVar15 + -0x30);
            if (lVar21 == 0) {
              if ((short)uVar2 < 1) {
                lVar21 = 1;
              }
              else {
                lVar21 = 1;
                uVar8 = 0;
                do {
                  lVar21 = lVar21 * pgVar5[g_a + 1000].nblock[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar27 != uVar8);
              }
              if ((proc < 0) || (lVar21 <= proc)) {
LAB_00185237:
                if (0 < (short)uVar2) {
                  memset(err_string,0,uVar27 << 3);
LAB_00185266:
                  memset(_hi,0xff,uVar27 << 3);
                }
              }
              else if (0 < (short)uVar2) {
                lVar15 = *(long *)(pgVar5->name + lVar15 + -8);
                lVar21 = 0;
                uVar8 = 0;
                IVar12 = proc;
                do {
                  lVar22 = (long)pgVar5[g_a + 1000].nblock[uVar8];
                  lVar18 = lVar15 + (IVar12 % lVar22) * 8;
                  hi_loc[uVar8 - 0x20] = *(Integer *)(lVar18 + lVar21 * 8);
                  if (IVar12 % lVar22 == lVar22 + -1) {
                    CVar24 = pgVar5[g_a + 1000].dims[uVar8];
                  }
                  else {
                    CVar24 = *(long *)(lVar18 + 8 + lVar21 * 8) + -1;
                  }
                  lVar21 = lVar21 + lVar22;
                  _hi[uVar8] = CVar24;
                  uVar8 = uVar8 + 1;
                  IVar12 = IVar12 / lVar22;
                } while (uVar27 != uVar8);
              }
            }
            else if (proc < lVar21) {
              if ((short)uVar2 < 1) {
                lVar21 = 1;
              }
              else {
                lVar21 = 1;
                uVar8 = 0;
                do {
                  lVar21 = lVar21 * pgVar5[g_a + 1000].nblock[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar27 != uVar8);
              }
              if ((proc < 0) || (lVar21 <= proc)) goto LAB_00185237;
              if (0 < (short)uVar2) {
                lVar15 = *(long *)(pgVar5->name + lVar15 + -8);
                lVar21 = 0;
                uVar8 = 0;
                IVar12 = proc;
                do {
                  lVar22 = (long)pgVar5[g_a + 1000].nblock[uVar8];
                  lVar18 = lVar15 + (IVar12 % lVar22) * 8;
                  hi_loc[uVar8 - 0x20] = *(Integer *)(lVar18 + lVar21 * 8);
                  if (IVar12 % lVar22 == lVar22 + -1) {
                    CVar24 = pgVar5[g_a + 1000].dims[uVar8];
                  }
                  else {
                    CVar24 = *(long *)(lVar18 + 8 + lVar21 * 8) + -1;
                  }
                  lVar21 = lVar21 + lVar22;
                  _hi[uVar8] = CVar24;
                  uVar8 = uVar8 + 1;
                  IVar12 = IVar12 / lVar22;
                } while (uVar27 != uVar8);
              }
            }
            else if (0 < (short)uVar2) {
              memset(err_string,0,(ulong)uVar2 << 3);
              goto LAB_00185266;
            }
          }
          pcVar25 = local_6b8;
          if (uVar27 == 1) {
            ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)pgVar5->width + local_6c8) * 2
                        + 1;
          }
          if ((short)uVar2 < 2) {
            lVar21 = 1;
            lVar15 = 0;
          }
          else {
            lVar21 = 1;
            lVar15 = 0;
            lVar18 = 0;
            do {
              lVar15 = lVar15 + plo_rcv[lVar18] * lVar21;
              lVar22 = (_hi[lVar18] - hi_loc[lVar18 + -0x20]) + pgVar5[g_a + 1000].width[lVar18] * 2
                       + 1;
              ld_loc[lVar18] = lVar22;
              lVar21 = lVar21 * lVar22;
              lVar18 = lVar18 + 1;
            } while (uVar27 - 1 != lVar18);
          }
          lVar18 = plo_rcv[uVar27 - 1];
          stride_snd[0] = iVar3;
          stride_rcv[0] = iVar3;
          if (sVar1 != 1) {
            lVar22 = 0;
            iVar14 = iVar3;
            iVar19 = iVar3;
            do {
              IVar12 = ld_loc[lVar22];
              iVar19 = iVar19 * (int)IVar12;
              stride_rcv[lVar22] = iVar19;
              iVar14 = iVar14 * (int)IVar12;
              stride_snd[lVar22] = iVar14;
              stride_rcv[lVar22 + 1] = iVar19;
              stride_snd[lVar22 + 1] = iVar14;
              lVar22 = lVar22 + 1;
            } while (local_5a8 != lVar22);
          }
          lVar22 = 0;
          do {
            count[lVar22] = ((int)phi_rcv[lVar22] - (int)plo_rcv[lVar22]) + 1;
            lVar22 = lVar22 + 1;
          } while (ndim != lVar22);
          lVar28 = 1;
          lVar22 = 0;
          do {
            lVar28 = lVar28 * ((phi_snd[lVar22] - plo_snd[lVar22]) + 1);
            lVar22 = lVar22 + 1;
          } while (ndim != lVar22);
          count[0] = count[0] * iVar3;
          armci_write_strided((void *)((lVar7 * lVar17 + lVar16) * lVar13 + lVar20),local_68c,
                              stride_snd,count,local_6b8);
          if (GAme != local_6a0) {
            iVar19 = (int)lVar28 * iVar3;
            uVar27 = (ulong)*(int *)((long)GA->nblock + idx * 4 + local_6c8);
            iVar14 = (int)local_6d0;
            if ((uVar27 & 1) == 0) {
              if ((*(byte *)(index + idx) & 1) == 0) {
                armci_msg_rcv(iVar14,local_6c0,(int)local_6b0,&msglen,(int)local_6a0);
              }
              else {
                armci_msg_snd(iVar14,local_6b8,iVar19,(int)local_6a8);
              }
              iVar26 = (int)local_6d0;
              if ((*(byte *)(index + idx) & 1) == 0) {
                armci_msg_snd(iVar26,local_6b8,iVar19,(int)local_6a8);
                pcVar25 = local_6c0;
                goto LAB_001855d3;
              }
              iVar19 = (int)local_6b0;
              iVar14 = (int)local_6a0;
            }
            else {
              if ((index[idx] & 1U) == 0) {
                if (index[idx] != 0) {
                  armci_msg_rcv(iVar14,local_6c0,(int)local_6b0,&msglen,(int)local_6a0);
                }
              }
              else {
                armci_msg_snd(iVar14,local_6b8,iVar19,(int)local_6a8);
              }
              iVar14 = (int)local_6a0;
              uVar27 = uVar27 - 1;
              if ((index[idx] & 1U) == 0) {
                if (index[idx] != uVar27) {
                  armci_msg_snd((int)local_6d0,local_6b8,iVar19,(int)local_6a8);
                  goto LAB_00185579;
                }
              }
              else {
                armci_msg_rcv((int)local_6d0,local_6c0,(int)local_6b0,&msglen,iVar14);
LAB_00185579:
                iVar14 = (int)local_6a0;
              }
              if (index[idx] == uVar27) {
                armci_msg_snd((int)local_6d0,local_6b8,iVar19,(int)local_6a8);
                iVar14 = (int)local_6a0;
              }
              pcVar25 = local_6c0;
              if (index[idx] != 0) goto LAB_001855d3;
              iVar26 = (int)local_6d0;
              iVar19 = (int)local_6b0;
            }
            pcVar25 = local_6c0;
            armci_msg_rcv(iVar26,local_6c0,iVar19,&msglen,iVar14);
          }
LAB_001855d3:
          armci_read_strided((void *)((lVar21 * lVar18 + lVar15) * lVar13 + lVar20),local_68c,
                             stride_rcv,count,pcVar25);
          local_698 = local_698 + 2;
          IVar12 = local_5a0;
        }
        if (*(int *)((long)GA->block_dims + local_6c8 + -8) != 0) {
          increment[idx] = width[idx] * 2;
        }
        idx = idx + 1;
      } while (idx != ndim);
    }
    pnga_free(local_6c0);
    pnga_free(local_6b8);
    free(map);
    free(proclist);
  }
  return 1;
}

Assistant:

logical pnga_update44_ghosts(Integer g_a)
{
  Integer idx, idir, i, np, handle=GA_OFFSET + g_a;
  Integer size, buflen, buftot, bufsize, ndim, increment[MAXDIM];
  Integer proc_rem_snd, proc_rem_rcv, pmax;
  Integer msgcnt, length;
  Integer width[MAXDIM], dims[MAXDIM], index[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_snd[MAXDIM], phi_snd[MAXDIM];
  Integer lo_rcv[MAXDIM], hi_rcv[MAXDIM];
  Integer slo_rcv[MAXDIM], shi_rcv[MAXDIM];
  Integer plo_rcv[MAXDIM], phi_rcv[MAXDIM];
  Integer ld_loc[MAXDIM];
  int msglen;
  int stride_snd[MAXDIM], stride_rcv[MAXDIM],count[MAXDIM];
  char *ptr_snd, *ptr_rcv;
  char send_name[32], rcv_name[32];
  void *snd_ptr, *rcv_ptr, *snd_ptr_orig, *rcv_ptr_orig;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This implementation make use of explicit message passing to perform
   * the update. Separate message types for the updates in each coordinate
   * direction are used to maintain synchronization locally and to
   * guarantee that the data is present before the updates in a new
   * coordinate direction take place.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rcv[], hi_rcv[]: The lower and upper indices of the blocks
   *       of data that will be either sent to or received from a remote
   *       processor. These indices are NOT corrected for wrap-around
   *       (periodic) boundary conditions so they can be negative or greater
   *       than the array dimension values held in dims[].
   *
   *       slo_rcv[], shi_rcv[]: Similar to lo_rcv[] and hi_rcv[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions.
   *
   *       plo_rcv[], phi_rcv[]: The local indices of the local data patch
   *       that receive that message from the remote processor.
   *
   *       plo_snd[], phi_snd[]: The local indices of the data patch
   *       that will be sent to the remote processor. Note that the
   *       dimensions of the patches represented by plo_rec[], plo_rec[] and
   *       plo_snd[], phi_snd[] must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update44_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update44_ghosts:malloc failed (_ga_proclist)",0);

  msgcnt = 0;

  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);
  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  /* Try to find maximum size of message that will be sent during
   * update operations and use this to allocate memory for message
   * passing buffers. */
  buftot = 1;
  for (i=0; i<ndim; i++) {
    buftot *= (hi_loc[i]-lo_loc[i] + 1 + 2*width[i]);
  }
  buflen = 1;
  for (i = 0; i < ndim; i++) {
    idir =  hi_loc[i] - lo_loc[i] + 1;
    if (buflen < (buftot/(idir + 2*width[i]))*width[i]) {
      buflen = (buftot/(idir + 2*width[i]))*width[i];
    }
  }
  bufsize = size*buflen;
  strcpy(send_name,"send_buffer");
  strcpy(rcv_name,"receive_buffer");
  snd_ptr_orig = snd_ptr = pnga_malloc(buflen, GA[handle].type, send_name);
  rcv_ptr_orig = rcv_ptr = pnga_malloc(buflen, GA[handle].type, rcv_name);

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = hi_loc[i] + 1;
          hi_rcv[i] = hi_loc[i] + width[i];
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] > dims[i]) {
            slo_rcv[i] = 1;
            shi_rcv[i] = width[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_rcv];
      }

      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = width[i];
            phi_snd[i] = 2*width[i] - 1;
            plo_rcv[i] = hi_loc[i] - lo_loc[i] + width[i] + 1;
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + 2*width[i];
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, &ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 1: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, &ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 1: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, &length);
      length *= size;
      count[0] *= size;

      /* Fill send buffer with data. */
#if GHOST_PRINT
      printf("p[%d]b 1: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)ptr_snd,
              (Integer)ptr_rcv);
      printf("p[%d]b 1: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)length, (int)proc_rem_snd, (int)proc_rem_rcv);
      printf("p[%d]b 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]b 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]b 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]b 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d]b 1: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      armci_write_strided(ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

#if GHOST_PRINT
      printf("p[%d] 1: msgcnt: %d length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, msgcnt, length, bufsize, (int)proc_rem_snd, (int)proc_rem_rcv);
      fflush(stdout);
#endif
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;
      if (GAme != proc_rem_snd) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else if (index[idx] != pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else if (index[idx] != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          if (index[idx] == pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      msgcnt++;
      /* copy data back into global array */
      armci_read_strided(ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);

      /* Find parameters for message in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = lo_loc[i] - width[i];
          hi_rcv[i] = lo_loc[i] - 1;
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] < 1) {
            slo_rcv[i] = dims[i] - width[i] + 1;
            shi_rcv[i] = dims[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_rcv];
      }
      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = hi_loc[i] - lo_loc[i] + 1;
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = 0;
            phi_rcv[i] = width[i] - 1;
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, &ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 2: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, &ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 2: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, &length);
      length *= size;
      count[0] *= size;

      /* Need to reallocate memory if length > buflen */
      /* TO DO */

      /* Fill send buffer with data. */
#if GHOST_PRINT
      printf("p[%d]b 2: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)ptr_snd,
              (Integer)ptr_rcv);
      printf("p[%d]b 2: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)length, (int)proc_rem_snd, (int)proc_rem_rcv);
      printf("p[%d]b 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]b 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]b 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]b 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d]b 2: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      armci_write_strided(ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

#if GHOST_PRINT
      printf("p[%d] 2: msgcnt: %d length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, msgcnt, length, bufsize, (int)proc_rem_snd, (int)proc_rem_rcv);
      fflush(stdout);
#endif
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;
      if (GAme != proc_rem_rcv) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else if (index[idx] != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else if (index[idx] != pmax) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == pmax) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          if (index[idx] == 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      /* copy data back into global array */
      armci_read_strided(ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);
      msgcnt++;
    }
    if (GA[handle].corner_flag)
      increment[idx] = 2*width[idx];
  }

  pnga_free(rcv_ptr_orig);
  pnga_free(snd_ptr_orig);
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}